

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O2

bool __thiscall
Rml::ElementAnimation::InternalAddKey
          (ElementAnimation *this,float time,Property *in_property,Element *element,Tween tween)

{
  Vector<AnimationKey> *this_00;
  byte bVar1;
  Unit UVar2;
  int iVar3;
  Type TVar4;
  Type TVar5;
  bool bVar6;
  code *pcVar7;
  Transform *this_01;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  pointer pTVar13;
  ulong uVar14;
  ulong *puVar15;
  pointer puVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  char *pcVar20;
  PrepareTransformResult result;
  ulong uVar21;
  pointer pTVar22;
  Type *pTVar23;
  pointer pTVar24;
  TransformPrimitive *pTVar25;
  PrimitiveList *__range2;
  pointer pAVar26;
  Transform *pTVar27;
  long lVar28;
  int iVar29;
  TransformPrimitive *primitive;
  pointer pAVar30;
  ulong uVar31;
  Transform *pTVar32;
  byte bVar33;
  reference rVar34;
  reference rVar35;
  size_t i_big;
  ulong local_140;
  Transform *local_138;
  ulong local_130;
  int local_124;
  int local_120;
  float time_local;
  Vector<size_t> matching_indices;
  undefined1 local_f0 [72];
  ulong local_a8;
  ulong local_a0;
  ulong *local_98;
  ulong local_90;
  ulong local_88;
  Property *local_80;
  ulong *local_78;
  ulong local_70;
  Tween tween_local;
  Vector<bool> dirty_list;
  
  tween_local.callback = tween.callback;
  tween_local._0_8_ = tween._0_8_;
  bVar33 = 0;
  time_local = time;
  if ((in_property->unit & (FILTER|DECORATOR|TRANSFORM|ANGLE|NUMBER_LENGTH_PERCENT|COLOUR|KEYWORD))
      == UNKNOWN) {
    pcVar20 = "Property value does not";
    if (in_property->unit == BOXSHADOWLIST) {
      pcVar20 = "Box shadows do not";
    }
    Property::ToString_abi_cxx11_((String *)local_f0,in_property);
    Log::Message(LT_WARNING,"%s support animations or transitions. Value: %s",pcVar20);
    ::std::__cxx11::string::~string((string *)local_f0);
LAB_00288b16:
    bVar9 = false;
  }
  else {
    this_00 = &this->keys;
    ::std::vector<Rml::AnimationKey,std::allocator<Rml::AnimationKey>>::
    emplace_back<float&,Rml::Property_const&,Rml::Tween&>
              ((vector<Rml::AnimationKey,std::allocator<Rml::AnimationKey>> *)this_00,&time_local,
               in_property,&tween_local);
    pAVar26 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    UVar2 = pAVar26[-1].property.unit;
    if (UVar2 == FILTER) {
      if ((pAVar26[-1].property.value.type != FILTERSPTR) &&
         (bVar9 = Assert("RMLUI_ASSERT(property.value.GetType() == Variant::FILTERSPTR)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                         ,0x27f), !bVar9)) {
LAB_00288b2c:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      if (*(long *)pAVar26[-1].property.value.data != 0) {
        return true;
      }
      ::std::make_shared<Rml::FilterDeclarationList>();
      Variant::operator=(&pAVar26[-1].property.value,
                         (shared_ptr<Rml::FilterDeclarationList> *)local_f0);
    }
    else {
      if (UVar2 != DECORATOR) {
        if (UVar2 != TRANSFORM) {
          return true;
        }
        pAVar30 = (this_00->
                  super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        iVar29 = (int)(((long)pAVar26 - (long)pAVar30) / 0x68);
        uVar11 = iVar29 - 1;
        local_140 = (ulong)uVar11;
        lVar28 = (long)(int)uVar11;
        bVar1 = 1;
        local_80 = in_property;
        while( true ) {
          uVar12 = ((long)pAVar26 - (long)pAVar30) / 0x68;
          if ((int)uVar12 <= lVar28) break;
          if ((pAVar30[lVar28].property.value.type != TRANSFORMPTR) &&
             (bVar9 = Assert("RMLUI_ASSERT(property.value.GetType() == Variant::TRANSFORMPTR)",
                             "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                             ,0x227), !bVar9)) goto LAB_00288b2c;
          pTVar27 = *(Transform **)pAVar30[lVar28].property.value.data;
          if (pTVar27 == (Transform *)0x0) {
            ::std::make_shared<Rml::Transform>();
            Variant::operator=(&pAVar30[lVar28].property.value,
                               (shared_ptr<Rml::Transform> *)local_f0);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
            pTVar27 = *(Transform **)pAVar30[lVar28].property.value.data;
          }
          pTVar24 = (pTVar27->primitives).
                    super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar13 = (pTVar27->primitives).
                    super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          do {
            if (pTVar24 == pTVar13) goto LAB_00288494;
            bVar9 = TransformUtilities::PrepareForInterpolation(pTVar24,element);
            pTVar24 = pTVar24 + 1;
          } while (bVar9);
          bVar9 = CombineAndDecompose(pTVar27,element);
          bVar1 = bVar1 & bVar9;
LAB_00288494:
          lVar28 = lVar28 + 1;
          pAVar30 = (this->keys).
                    super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pAVar26 = (this->keys).
                    super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        if (bVar1 != 0) {
          if (iVar29 < 2) {
            return true;
          }
          if (uVar12 < 2) {
            return true;
          }
          local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
          ::std::vector<bool,_std::allocator<bool>_>::vector
                    (&dirty_list,(long)((uVar12 << 0x20) + 0x100000000) >> 0x20,(bool *)local_f0,
                     (allocator_type *)&matching_indices);
          uVar31 = local_140;
          rVar34 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&dirty_list,local_140 & 0xffffffff);
          local_124 = (int)uVar12 * 3;
          *rVar34._M_p = *rVar34._M_p | rVar34._M_mask;
          iVar29 = -1;
          local_90 = uVar12;
          while( true ) {
            iVar18 = (int)uVar31;
            bVar9 = (int)uVar12 <= iVar18;
            bVar6 = iVar29 < local_124;
            bVar8 = bVar6;
            if (bVar9 || !bVar6) break;
            uVar21 = uVar31 & 0xffffffff;
            rVar34 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&dirty_list,uVar21);
            if ((*rVar34._M_p & rVar34._M_mask) == 0) {
              uVar11 = iVar18 + 1;
            }
            else {
              uVar12 = (ulong)(iVar18 - 1U);
              pAVar26 = (this_00->
                        super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              if ((pAVar26[uVar12].property.unit != TRANSFORM) ||
                 (pAVar26[uVar21].property.unit != TRANSFORM)) {
                bVar8 = true;
                break;
              }
              bVar8 = true;
              pTVar27 = *(Transform **)((long)&pAVar26[uVar12].property.value + 8);
              local_138 = *(Transform **)((long)&pAVar26[uVar21].property.value + 8);
              pTVar24 = (pTVar27->primitives).
                        super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pTVar13 = (pTVar27->primitives).
                        super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              lVar17 = (long)pTVar13 - (long)pTVar24;
              pTVar22 = (local_138->primitives).
                        super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar28 = (long)(local_138->primitives).
                             super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar22;
              local_140 = uVar31;
              local_120 = iVar29;
              local_70 = uVar21;
              if (lVar17 == lVar28) {
                lVar28 = 0;
                uVar21 = 0;
                for (uVar31 = 0; uVar31 < (ulong)(((long)pTVar13 - (long)pTVar24) / 0x48);
                    uVar31 = uVar31 + 1) {
                  iVar29 = *(int *)((long)&pTVar24->type + lVar28);
                  iVar3 = *(int *)((long)&pTVar22->type + lVar28);
                  bVar10 = TransformUtilities::TryConvertToMatchingGenericType
                                     ((TransformPrimitive *)((long)&pTVar24->type + lVar28),
                                      (TransformPrimitive *)((long)&pTVar22->type + lVar28));
                  if (!bVar10) {
                    lVar17 = (long)(pTVar27->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar27->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                    lVar28 = (long)(local_138->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_138->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                    goto LAB_00288773;
                  }
                  pTVar24 = (pTVar27->primitives).
                            super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pTVar13 = (pTVar27->primitives).
                            super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  uVar11 = (uint)uVar21 | (uint)(*(int *)((long)&pTVar24->type + lVar28) != iVar29);
                  pTVar22 = (local_138->primitives).
                            super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (*(int *)((long)&pTVar22->type + lVar28) != iVar3) {
                    uVar11 = uVar11 | 2;
                  }
                  uVar21 = (ulong)uVar11;
                  lVar28 = lVar28 + 0x48;
                }
              }
              else {
LAB_00288773:
                uVar31 = lVar17 / 0x48;
                uVar14 = lVar28 / 0x48;
                if (uVar31 != uVar14) {
                  pTVar32 = pTVar27;
                  this_01 = local_138;
                  if (uVar31 < uVar14) {
                    pTVar32 = local_138;
                    this_01 = pTVar27;
                  }
                  matching_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  matching_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  matching_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_a8 = uVar14;
                  local_a0 = uVar31;
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                            (&matching_indices,
                             ((long)(this_01->primitives).
                                    super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_01->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x48 + 1);
                  i_big = 0;
                  local_130 = 0;
                  for (uVar31 = 0;
                      local_88 = ((long)(this_01->primitives).
                                        super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_01->primitives).
                                       super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x48,
                      uVar31 < local_88; uVar31 = uVar31 + 1) {
                    while( true ) {
                      pTVar24 = (pTVar32->primitives).
                                super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      if ((ulong)(((long)(pTVar32->primitives).
                                         super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar24)
                                 / 0x48) <= i_big) goto LAB_002888be;
                      TVar4 = pTVar24[i_big].type;
                      bVar10 = TransformUtilities::TryConvertToMatchingGenericType
                                         ((this_01->primitives).
                                          super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar31,
                                          pTVar24 + i_big);
                      if (bVar10) break;
                      i_big = i_big + 1;
                    }
                    TVar5 = (pTVar32->primitives).
                            super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start[i_big].type;
                    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                              (&matching_indices,&i_big);
                    local_130 = CONCAT71((int7)(local_130 >> 8),(byte)local_130 | TVar5 != TVar4);
                    i_big = i_big + 1;
                  }
                  local_f0._0_8_ =
                       ((long)(pTVar32->primitives).
                              super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar32->primitives).
                             super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x48;
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  emplace_back<unsigned_long>(&matching_indices,(unsigned_long *)local_f0);
                  ::std::vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>::
                  reserve(&this_01->primitives,
                          ((long)(pTVar32->primitives).
                                 super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar32->primitives).
                                super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x48);
                  local_98 = matching_indices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  uVar21 = 0;
                  puVar16 = matching_indices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  while (puVar16 != local_98) {
                    uVar14 = *puVar16;
                    lVar28 = uVar21 * 0x48;
                    local_78 = puVar16;
                    for (; uVar21 < uVar14; uVar21 = uVar21 + 1) {
                      pTVar23 = (Type *)((long)&((pTVar32->primitives).
                                                 super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->type +
                                        lVar28);
                      pTVar25 = (TransformPrimitive *)local_f0;
                      for (lVar17 = 0x12; lVar17 != 0; lVar17 = lVar17 + -1) {
                        pTVar25->type = *pTVar23;
                        pTVar23 = pTVar23 + (ulong)bVar33 * -2 + 1;
                        pTVar25 = (TransformPrimitive *)((long)pTVar25 + (ulong)bVar33 * -8 + 4);
                      }
                      TransformUtilities::SetIdentity((TransformPrimitive *)local_f0);
                      ::std::
                      vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>::
                      insert(&this_01->primitives,
                             (TransformPrimitive *)
                             ((long)&((this_01->primitives).
                                      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->type + lVar28),
                             (TransformPrimitive *)local_f0);
                      lVar28 = lVar28 + 0x48;
                    }
                    uVar21 = uVar14 + 1;
                    puVar16 = local_78 + 1;
                  }
                  uVar21 = (ulong)(2 - (local_a0 < local_a8));
                  if ((local_130 & 1) != 0) {
                    uVar21 = 3;
                  }
LAB_002888be:
                  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                            (&matching_indices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
                  if (local_88 <= uVar31) goto LAB_00288904;
                }
                bVar10 = CombineAndDecompose(pTVar27,element);
                if (!bVar10) break;
                bVar10 = CombineAndDecompose(local_138,element);
                uVar21 = 3;
                if (!bVar10) break;
              }
LAB_00288904:
              rVar34 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&dirty_list,local_70);
              *rVar34._M_p = *rVar34._M_p & ~rVar34._M_mask;
              rVar34 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&dirty_list,uVar12);
              uVar31 = *rVar34._M_p;
              rVar35 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&dirty_list,uVar12);
              puVar15 = rVar35._M_p;
              if (((uVar21 & 1) == 0) && ((uVar31 & rVar34._M_mask) == 0)) {
                uVar12 = ~rVar35._M_mask & *puVar15;
              }
              else {
                uVar12 = rVar35._M_mask | *puVar15;
              }
              *puVar15 = uVar12;
              uVar19 = (int)local_140 + 1;
              rVar34 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&dirty_list,(ulong)uVar19);
              uVar12 = *rVar34._M_p;
              rVar35 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&dirty_list,(ulong)uVar19);
              puVar15 = rVar35._M_p;
              if (((uVar21 & 2) == 0) && ((uVar12 & rVar34._M_mask) == 0)) {
                uVar12 = ~rVar35._M_mask & *puVar15;
              }
              else {
                uVar12 = rVar35._M_mask | *puVar15;
              }
              uVar11 = iVar18 - 1U;
              if ((uVar21 & 1) == 0) {
                uVar11 = uVar19;
              }
              *puVar15 = uVar12;
              uVar12 = local_90;
              iVar29 = local_120;
              if ((int)local_140 < 2) {
                uVar11 = uVar19;
              }
            }
            iVar29 = iVar29 + 1;
            uVar31 = (ulong)uVar11;
          }
          ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&dirty_list.super__Bvector_base<std::allocator<bool>_>);
          if ((bVar9 || !bVar6) && (bVar8)) {
            return true;
          }
        }
        Property::ToString_abi_cxx11_((String *)local_f0,local_80);
        Log::Message(LT_WARNING,"Could not add animation key with property \'%s\'.",local_f0._0_8_);
        ::std::__cxx11::string::~string((string *)local_f0);
        ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::pop_back(this_00);
        goto LAB_00288b16;
      }
      if ((pAVar26[-1].property.value.type != DECORATORSPTR) &&
         (bVar9 = Assert("RMLUI_ASSERT(property.value.GetType() == Variant::DECORATORSPTR)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                         ,0x277), !bVar9)) goto LAB_00288b2c;
      if (*(long *)pAVar26[-1].property.value.data != 0) {
        return true;
      }
      ::std::make_shared<Rml::DecoratorDeclarationList>();
      Variant::operator=(&pAVar26[-1].property.value,
                         (shared_ptr<Rml::DecoratorDeclarationList> *)local_f0);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool ElementAnimation::InternalAddKey(float time, const Property& in_property, Element& element, Tween tween)
{
	const Units valid_units =
		(Unit::NUMBER_LENGTH_PERCENT | Unit::ANGLE | Unit::COLOUR | Unit::TRANSFORM | Unit::KEYWORD | Unit::DECORATOR | Unit::FILTER);

	if (!Any(in_property.unit & valid_units))
	{
		const char* property_type = (in_property.unit == Unit::BOXSHADOWLIST ? "Box shadows do not" : "Property value does not");
		Log::Message(Log::LT_WARNING, "%s support animations or transitions. Value: %s", property_type, in_property.ToString().c_str());
		return false;
	}

	keys.emplace_back(time, in_property, tween);
	Property& property = keys.back().property;
	bool result = true;

	if (property.unit == Unit::TRANSFORM)
	{
		result = PrepareTransforms(keys, element, (int)keys.size() - 1);
	}
	else if (property.unit == Unit::DECORATOR)
	{
		PrepareDecorator(keys.back());
	}
	else if (property.unit == Unit::FILTER)
	{
		PrepareFilter(keys.back());
	}

	if (!result)
	{
		Log::Message(Log::LT_WARNING, "Could not add animation key with property '%s'.", in_property.ToString().c_str());
		keys.pop_back();
	}

	return result;
}